

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatzinc.h
# Opt level: O2

Array * __thiscall FlatZinc::ParserState::getOutput(ParserState *this)

{
  Node **__x;
  pointer ppNVar1;
  bool bVar2;
  Array *pAVar3;
  String *pSVar4;
  Node **j;
  pointer __x_00;
  pointer __lhs;
  vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_> *this_00;
  allocator local_89;
  String *local_88;
  Array *local_80;
  pointer local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,FlatZinc::AST::Node*>*,std::vector<std::pair<std::__cxx11::string,FlatZinc::AST::Node*>,std::allocator<std::pair<std::__cxx11::string,FlatZinc::AST::Node*>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((this->_output).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pAVar3 = (Array *)operator_new(0x20);
  AST::Array::Array(pAVar3,0);
  local_78 = (this->_output).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &pAVar3->a;
  local_80 = pAVar3;
  for (__lhs = (this->_output).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __lhs != local_78; __lhs = __lhs + 1) {
    pSVar4 = (String *)operator_new(0x28);
    std::operator+(&local_70,&__lhs->first," = ");
    AST::String::String(pSVar4,&local_70);
    local_88 = pSVar4;
    std::vector<FlatZinc::AST::Node*,std::allocator<FlatZinc::AST::Node*>>::
    emplace_back<FlatZinc::AST::Node*>
              ((vector<FlatZinc::AST::Node*,std::allocator<FlatZinc::AST::Node*>> *)this_00,
               (Node **)&local_88);
    std::__cxx11::string::~string((string *)&local_70);
    __x = &__lhs->second;
    bVar2 = AST::Node::isArray(__lhs->second);
    if (bVar2) {
      pAVar3 = AST::Node::getArray(*__x);
      ppNVar1 = (pAVar3->a).
                super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (__x_00 = (pAVar3->a).
                    super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; __x_00 != ppNVar1;
          __x_00 = __x_00 + 1) {
        std::vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>::push_back
                  (this_00,__x_00);
        *__x_00 = (value_type)0x0;
      }
      if (*__x != (Node *)0x0) {
        (*(*__x)->_vptr_Node[1])();
      }
    }
    else {
      std::vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>::push_back
                (this_00,__x);
    }
    pSVar4 = (String *)operator_new(0x28);
    std::__cxx11::string::string((string *)&local_50,";\n",&local_89);
    AST::String::String(pSVar4,&local_50);
    local_88 = pSVar4;
    std::vector<FlatZinc::AST::Node*,std::allocator<FlatZinc::AST::Node*>>::
    emplace_back<FlatZinc::AST::Node*>
              ((vector<FlatZinc::AST::Node*,std::allocator<FlatZinc::AST::Node*>> *)this_00,
               (Node **)&local_88);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return local_80;
}

Assistant:

AST::Array* getOutput() {
		std::sort(_output.begin(), _output.end());
		auto* a = new AST::Array();
		for (auto& i : _output) {
			a->a.push_back(new AST::String(i.first + " = "));
			if (i.second->isArray()) {
				AST::Array* oa = i.second->getArray();
				for (auto& j : oa->a) {
					a->a.push_back(j);
					j = nullptr;
				}
				delete i.second;
			} else {
				a->a.push_back(i.second);
			}
			a->a.push_back(new AST::String(";\n"));
		}
		return a;
	}